

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O0

bool have_schar(char *arg)

{
  int iVar1;
  char *in_RDI;
  char *local_10;
  
  local_10 = in_RDI;
  if (*in_RDI != '\0') {
    for (; *local_10 != '\0'; local_10 = local_10 + 1) {
      iVar1 = isdigit((int)*local_10);
      if (((iVar1 == 0) && (iVar1 = isalpha((int)*local_10), iVar1 == 0)) && (*local_10 != ' ')) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool have_schar(char *arg)
{
	if (*arg == '\0')
		return false;

	for (; *arg != '\0'; arg++)
	{
		if (!isdigit(*arg) && !isalpha(*arg) && *arg != ' ')
			return true;
	}

	return false;
}